

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringstream.cpp
# Opt level: O2

string * __thiscall
embree::StringStream::next_abi_cxx11_(string *__return_storage_ptr__,StringStream *this)

{
  bool bVar1;
  uint uVar2;
  int *piVar3;
  uint *puVar4;
  runtime_error *this_00;
  Stream<int> *this_01;
  vector<char,_std::allocator<char>_> str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  while (piVar3 = Stream<int>::peek((this->cin).ptr), *piVar3 != -1) {
    bVar1 = std::operator!=(&this->endl,"");
    if ((bVar1) && (piVar3 = Stream<int>::peek((this->cin).ptr), *piVar3 == 10)) {
      Stream<int>::drop((this->cin).ptr);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->endl);
      return __return_storage_ptr__;
    }
    if ((this->multiLine == true) && (piVar3 = Stream<int>::peek((this->cin).ptr), *piVar3 == 0x5c))
    {
      Stream<int>::drop((this->cin).ptr);
      piVar3 = Stream<int>::peek((this->cin).ptr);
      this_01 = (this->cin).ptr;
      if (*piVar3 != 10) {
        Stream<int>::unget(this_01,1);
        goto LAB_0018cb7a;
      }
    }
    else {
LAB_0018cb7a:
      puVar4 = (uint *)Stream<int>::peek((this->cin).ptr);
      if ((0xff < (ulong)*puVar4) || (this->isSepMap[*puVar4] != true)) break;
      this_01 = (this->cin).ptr;
    }
    Stream<int>::drop(this_01);
  }
  str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<char,_std::allocator<char>_>::reserve(&str,0x40);
  while (piVar3 = Stream<int>::peek((this->cin).ptr), *piVar3 != -1) {
    puVar4 = (uint *)Stream<int>::peek((this->cin).ptr);
    if (((ulong)*puVar4 < 0x100) && (this->isSepMap[*puVar4] != false)) break;
    uVar2 = Stream<int>::get((this->cin).ptr);
    if ((0xff < uVar2) || (this->isValidCharMap[uVar2] == false)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_70,'\x01');
      std::operator+(&local_50,"invalid character ",&local_70);
      std::operator+(&local_90,&local_50," in input");
      std::runtime_error::runtime_error(this_00,(string *)&local_90);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_90._M_dataplus._M_p._0_1_ = (undefined1)uVar2;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(&str,(char *)&local_90);
  }
  local_90._M_dataplus._M_p._0_1_ = 0;
  std::vector<char,_std::allocator<char>_>::emplace_back<char>(&str,(char *)&local_90);
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start,(allocator *)&local_90);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&str.super__Vector_base<char,_std::allocator<char>_>);
  return __return_storage_ptr__;
}

Assistant:

std::string StringStream::next()
  {
    /* skip separators */
    while (cin->peek() != EOF) {
      if (endl != "" && cin->peek() == '\n') { cin->drop(); return endl; }
      if (multiLine && cin->peek() == '\\') {
        cin->drop();
        if (cin->peek() == '\n') { cin->drop(); continue; }
        cin->unget();
      }
      if (!isSeparator(cin->peek())) break;
      cin->drop();
    }

    /* parse everything until the next separator */
    std::vector<char> str; str.reserve(64);
    while (cin->peek() != EOF && !isSeparator(cin->peek())) {
      int c = cin->get();
      if (!isValidChar(c)) throw std::runtime_error("invalid character "+std::string(1,c)+" in input");
      str.push_back((char)c);
    }
    str.push_back(0);
    return std::string(str.data());
  }